

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

Roaring64Map *
roaring::Roaring64Map::fastunion
          (Roaring64Map *__return_storage_ptr__,size_t n,Roaring64Map **inputs)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  roaring_bitmap_t *s;
  size_t i;
  size_t sVar6;
  anon_class_1_0_00000001 pq_comp;
  Roaring64Map *result;
  vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
  group_bitmaps;
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
  pq;
  anon_class_1_0_00000001 local_d1;
  Roaring64Map *local_d0;
  _Vector_base<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
  local_c8;
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
  local_b0;
  const_iterator local_90;
  undefined1 local_88 [8];
  const_iterator cStack_80;
  pointer local_78;
  Roaring local_58;
  
  local_88 = (undefined1  [8])0x0;
  cStack_80._M_node = (_Base_ptr)0x0;
  local_78 = (pointer)0x0;
  local_d0 = __return_storage_ptr__;
  std::
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
  ::priority_queue(&local_b0,&local_d1,(vector<pq_entry,_std::allocator<pq_entry>_> *)local_88);
  std::_Vector_base<pq_entry,_std::allocator<pq_entry>_>::~_Vector_base
            ((_Vector_base<pq_entry,_std::allocator<pq_entry>_> *)local_88);
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    p_Var2 = (inputs[sVar6]->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(inputs[sVar6]->roarings)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var4) {
      local_88 = (undefined1  [8])p_Var2;
      cStack_80._M_node = &p_Var4->_M_header;
      std::
      priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
      ::push(&local_b0,(value_type *)local_88);
    }
  }
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_d0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_node = &(local_d0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header;
  *(undefined8 *)&(local_d0->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(local_d0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (local_d0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_90._M_node;
  (local_d0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_90._M_node;
  (local_d0->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0->copyOnWrite = false;
  while (local_b0.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_b0.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    if (local_c8._M_impl.super__Vector_impl_data._M_finish !=
        local_c8._M_impl.super__Vector_impl_data._M_start) {
      local_c8._M_impl.super__Vector_impl_data._M_finish =
           local_c8._M_impl.super__Vector_impl_data._M_start;
    }
    _Var1 = ((local_b0.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
              super__Vector_impl_data._M_start)->iterator)._M_node[1]._M_color;
    while ((local_b0.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_b0.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
            super__Vector_impl_data._M_finish &&
           (p_Var3 = ((local_b0.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
                       super__Vector_impl_data._M_start)->iterator)._M_node,
           p_Var3[1]._M_color == _Var1))) {
      p_Var2 = ((local_b0.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
                 super__Vector_impl_data._M_start)->end)._M_node;
      local_88 = (undefined1  [8])&p_Var3[1]._M_parent;
      std::
      vector<roaring::api::roaring_bitmap_s_const*,std::allocator<roaring::api::roaring_bitmap_s_const*>>
      ::emplace_back<roaring::api::roaring_bitmap_s_const*>
                ((vector<roaring::api::roaring_bitmap_s_const*,std::allocator<roaring::api::roaring_bitmap_s_const*>>
                  *)&local_c8,(roaring_bitmap_s **)local_88);
      std::
      priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
      ::pop(&local_b0);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      if (p_Var5 != p_Var2) {
        local_88 = (undefined1  [8])p_Var5;
        cStack_80._M_node = p_Var2;
        std::
        priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
        ::push(&local_b0,(value_type *)local_88);
      }
    }
    s = (roaring_bitmap_t *)
        roaring_bitmap_or_many
                  ((long)local_c8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8._M_impl.super__Vector_impl_data._M_start >> 3,
                   (roaring_bitmap_t **)local_c8._M_impl.super__Vector_impl_data._M_start);
    Roaring::Roaring(&local_58,s);
    local_88._0_4_ = _Var1;
    Roaring::Roaring((Roaring *)&cStack_80,&local_58);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
    ::_M_emplace_hint_unique<std::pair<unsigned_int,roaring::Roaring>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                *)local_d0,local_90,(pair<unsigned_int,_roaring::Roaring> *)local_88);
    Roaring::~Roaring((Roaring *)&cStack_80);
    Roaring::~Roaring(&local_58);
  }
  std::
  _Vector_base<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
  ::~_Vector_base(&local_c8);
  std::_Vector_base<pq_entry,_std::allocator<pq_entry>_>::~_Vector_base
            ((_Vector_base<pq_entry,_std::allocator<pq_entry>_> *)&local_b0);
  return local_d0;
}

Assistant:

static Roaring64Map fastunion(size_t n, const Roaring64Map **inputs) {
        // The strategy here is to basically do a "group by" operation.
        // We group the input roarings by key, do a 32-bit
        // roaring_bitmap_or_many on each group, and collect the results.
        // We accomplish the "group by" operation using a priority queue, which
        // tracks the next key for each of our input maps. At each step, our
        // algorithm takes the next subset of maps that share the same next key,
        // runs roaring_bitmap_or_many on those bitmaps, and then advances the
        // current_iter on all the affected entries and then repeats.

        // There is an entry in our priority queue for each of the 'n' inputs.
        // For a given Roaring64Map, we look at its underlying 'roarings'
        // std::map, and take its begin() and end(). This forms our half-open
        // interval [current_iter, end_iter), which we keep in the priority
        // queue as a pq_entry. These entries are updated (removed and then
        // reinserted with the pq_entry.iterator field advanced by one step) as
        // our algorithm progresses. But when a given interval becomes empty
        // (i.e. pq_entry.iterator == pq_entry.end) it is not returned to the
        // priority queue.
        struct pq_entry {
            roarings_t::const_iterator iterator;
            roarings_t::const_iterator end;
        };

        // Custom comparator for the priority queue.
        auto pq_comp = [](const pq_entry &lhs, const pq_entry &rhs) {
            auto left_key = lhs.iterator->first;
            auto right_key = rhs.iterator->first;

            // We compare in the opposite direction than normal because priority
            // queues normally order from largest to smallest, but we want
            // smallest to largest.
            return left_key > right_key;
        };

        // Create and populate the priority queue.
        std::priority_queue<pq_entry, std::vector<pq_entry>, decltype(pq_comp)>
            pq(pq_comp);
        for (size_t i = 0; i < n; ++i) {
            const auto &roarings = inputs[i]->roarings;
            if (roarings.begin() != roarings.end()) {
                pq.push({roarings.begin(), roarings.end()});
            }
        }

        // A reusable vector that holds the pointers to the inner bitmaps that
        // we pass to the underlying 32-bit fastunion operation.
        std::vector<const roaring_bitmap_t *> group_bitmaps;

        // Summary of the algorithm:
        // 1. While the priority queue is not empty:
        //    A. Get its lowest key. Call this group_key
        //    B. While the lowest entry in the priority queue has a key equal to
        //       group_key:
        //       1. Remove this entry (the pair {current_iter, end_iter}) from
        //          the priority queue.
        //       2. Add the bitmap pointed to by current_iter to a list of
        //          32-bit bitmaps to process.
        //       3. Advance current_iter. Now it will point to a bitmap entry
        //          with some key greater than group_key (or it will point to
        //          end()).
        //       4. If current_iter != end_iter, reinsert the pair into the
        //          priority queue.
        //    C. Invoke the 32-bit roaring_bitmap_or_many() and add to result
        Roaring64Map result;
        while (!pq.empty()) {
            // Find the next key (the lowest key) in the priority queue.
            auto group_key = pq.top().iterator->first;

            // The purpose of the inner loop is to gather all the inner bitmaps
            // that share "group_key" into "group_bitmaps" so that they can be
            // fed to roaring_bitmap_or_many(). While we are doing this, we
            // advance those iterators to their next value and reinsert them
            // into the priority queue (unless they reach their end).
            group_bitmaps.clear();
            while (!pq.empty()) {
                auto candidate_current_iter = pq.top().iterator;
                auto candidate_end_iter = pq.top().end;

                auto candidate_key = candidate_current_iter->first;
                const auto &candidate_bitmap = candidate_current_iter->second;

                // This element will either be in the group (having
                // key == group_key) or it will not be in the group (having
                // key > group_key). (Note it cannot have key < group_key
                // because of the ordered nature of the priority queue itself
                // and the ordered nature of all the underlying roaring maps).
                if (candidate_key != group_key) {
                    // This entry, and (thanks to the nature of the priority
                    // queue) all other entries as well, are all greater than
                    // group_key, so we're done collecting elements for the
                    // current group. Because of the way this loop was written,
                    // the group will will always contain at least one element.
                    break;
                }

                group_bitmaps.push_back(&candidate_bitmap.roaring);
                // Remove this entry from the priority queue. Note this
                // invalidates pq.top() so make sure you don't have any dangling
                // references to it.
                pq.pop();

                // Advance 'candidate_current_iter' and insert a new entry
                // {candidate_current_iter, candidate_end_iter} into the
                // priority queue (unless it has reached its end).
                ++candidate_current_iter;
                if (candidate_current_iter != candidate_end_iter) {
                    pq.push({candidate_current_iter, candidate_end_iter});
                }
            }

            // Use the fast inner union to combine these.
            auto *inner_result = roaring_bitmap_or_many(group_bitmaps.size(),
                                                        group_bitmaps.data());
            // Insert the 32-bit result at end of the 'roarings' map of the
            // result we are building.
            result.roarings.insert(
                result.roarings.end(),
                std::make_pair(group_key, Roaring(inner_result)));
        }
        return result;
    }